

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorSaveBoundary(VP8EncIterator *it)

{
  int iVar1;
  VP8Encoder *pVVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  uint8_t *puVar5;
  long lVar6;
  
  pVVar2 = it->enc_;
  iVar1 = it->y_;
  puVar3 = it->yuv_out_;
  if (it->x_ < pVVar2->mb_w_ + -1) {
    puVar5 = puVar3 + 0xf;
    lVar6 = 0;
    do {
      it->y_left_[lVar6] = *puVar5;
      lVar6 = lVar6 + 1;
      puVar5 = puVar5 + 0x20;
    } while (lVar6 != 0x10);
    puVar5 = puVar3 + 0x1f;
    lVar6 = 0;
    do {
      it->u_left_[lVar6] = puVar5[-8];
      it->v_left_[lVar6] = *puVar5;
      lVar6 = lVar6 + 1;
      puVar5 = puVar5 + 0x20;
    } while (lVar6 != 8);
    it->y_left_[-1] = it->y_top_[0xf];
    it->u_left_[-1] = it->uv_top_[7];
    it->v_left_[-1] = it->uv_top_[0xf];
  }
  if (iVar1 < pVVar2->mb_h_ + -1) {
    puVar5 = it->y_top_;
    uVar4 = *(undefined8 *)(puVar3 + 0x1e8);
    *(undefined8 *)puVar5 = *(undefined8 *)(puVar3 + 0x1e0);
    *(undefined8 *)(puVar5 + 8) = uVar4;
    puVar5 = it->uv_top_;
    uVar4 = *(undefined8 *)(puVar3 + 0xf8);
    *(undefined8 *)puVar5 = *(undefined8 *)(puVar3 + 0xf0);
    *(undefined8 *)(puVar5 + 8) = uVar4;
  }
  return;
}

Assistant:

void VP8IteratorSaveBoundary(VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc_;
  const int x = it->x_, y = it->y_;
  const uint8_t* const ysrc = it->yuv_out_ + Y_OFF_ENC;
  const uint8_t* const uvsrc = it->yuv_out_ + U_OFF_ENC;
  if (x < enc->mb_w_ - 1) {   // left
    int i;
    for (i = 0; i < 16; ++i) {
      it->y_left_[i] = ysrc[15 + i * BPS];
    }
    for (i = 0; i < 8; ++i) {
      it->u_left_[i] = uvsrc[7 + i * BPS];
      it->v_left_[i] = uvsrc[15 + i * BPS];
    }
    // top-left (before 'top'!)
    it->y_left_[-1] = it->y_top_[15];
    it->u_left_[-1] = it->uv_top_[0 + 7];
    it->v_left_[-1] = it->uv_top_[8 + 7];
  }
  if (y < enc->mb_h_ - 1) {  // top
    memcpy(it->y_top_, ysrc + 15 * BPS, 16);
    memcpy(it->uv_top_, uvsrc + 7 * BPS, 8 + 8);
  }
}